

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O1

_Bool ecdsa_verify_msg_as_qelem
                (uint64_t *m_q,uint8_t *public_key,uint8_t *signature_r,uint8_t *signature_s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  _Bool _Var108;
  uint uVar109;
  uint64_t uVar110;
  uint64_t uVar111;
  uint64_t uVar112;
  uint64_t uVar113;
  uint64_t uVar114;
  uint64_t uVar115;
  uint64_t uVar116;
  uint64_t uVar117;
  sbyte sVar118;
  ulong uVar119;
  long lVar120;
  ulong uVar121;
  uint64_t t1;
  ulong uVar122;
  uint uVar123;
  uint64_t t12;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  uint64_t *puVar127;
  uint64_t *puVar128;
  uint64_t out0_3;
  uint64_t out0_2;
  uint64_t out0_8;
  ulong uVar129;
  uint uVar130;
  uint64_t *t11_3;
  ulong uVar131;
  uint uVar132;
  uint64_t *t11;
  ulong uVar133;
  _Bool _Var134;
  byte bVar135;
  uint64_t x [4];
  uint64_t tmp [28];
  uint64_t sinv [4];
  uint64_t tmp1 [12];
  uint64_t table2 [384];
  uint64_t local_eb8;
  ulong uStack_eb0;
  ulong local_ea8;
  ulong uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  uint64_t local_e58 [8];
  uint64_t local_e18;
  uint64_t local_e10;
  uint64_t local_e08;
  uint64_t local_e00;
  uint64_t local_df8 [12];
  ulong local_d98;
  ulong uStack_d90;
  ulong local_d88;
  ulong uStack_d80;
  ulong local_d78;
  ulong local_d70;
  ulong local_d68;
  ulong local_d60;
  uint64_t local_d58 [3];
  undefined8 local_d40;
  int iStack_d3c;
  uint64_t local_d38 [4];
  uint64_t local_d18;
  ulong uStack_d10;
  ulong local_d08;
  ulong uStack_d00;
  uint64_t local_cf8 [18];
  undefined1 local_c68 [16];
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  uint64_t local_c38 [12];
  uint64_t local_bd8 [12];
  uint64_t local_b78 [12];
  uint64_t local_b18 [12];
  uint64_t local_ab8 [12];
  uint64_t local_a58 [12];
  uint64_t local_9f8 [12];
  uint64_t local_998 [12];
  uint64_t local_938 [12];
  uint64_t local_8d8 [12];
  uint64_t local_878 [12];
  uint64_t local_818 [12];
  uint64_t local_7b8 [12];
  uint64_t local_758 [12];
  uint64_t local_6f8 [12];
  uint64_t local_698 [12];
  uint64_t local_638 [12];
  uint64_t local_5d8 [12];
  uint64_t local_578 [12];
  uint64_t local_518 [12];
  uint64_t local_4b8 [12];
  uint64_t local_458 [12];
  uint64_t local_3f8 [12];
  uint64_t local_398 [12];
  uint64_t local_338 [12];
  uint64_t local_2d8 [12];
  uint64_t local_278 [12];
  uint64_t local_218 [12];
  uint64_t local_1b8 [12];
  uint64_t local_158 [12];
  uint64_t local_f8 [12];
  uint64_t local_98 [13];
  
  bVar135 = 0;
  _Var134 = false;
  memset(local_df8,0,0xe0);
  _Var108 = load_point_vartime(local_df8,public_key);
  uVar129 = *(ulong *)(signature_r + 0x18);
  uVar119 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  uVar129 = *(ulong *)(signature_r + 0x10);
  uVar121 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  uVar129 = *(ulong *)(signature_r + 8);
  uVar125 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  uVar129 = *(ulong *)signature_r;
  uVar124 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  uVar129 = *(ulong *)(signature_s + 0x18);
  uVar122 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  uVar129 = *(ulong *)(signature_s + 0x10);
  uVar131 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  uVar129 = *(ulong *)(signature_s + 8);
  uVar133 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  uVar129 = *(ulong *)signature_s;
  uVar129 = uVar129 >> 0x38 | (uVar129 & 0xff000000000000) >> 0x28 |
            (uVar129 & 0xff0000000000) >> 0x18 | (uVar129 & 0xff00000000) >> 8 |
            (uVar129 & 0xff000000) << 8 | (uVar129 & 0xff0000) << 0x18 | (uVar129 & 0xff00) << 0x28
            | uVar129 << 0x38;
  if (_Var108) {
    _Var134 = false;
    local_d98 = uVar119;
    uStack_d90 = uVar121;
    local_d88 = uVar125;
    uStack_d80 = uVar124;
    local_d78 = uVar122;
    local_d70 = uVar131;
    local_d68 = uVar133;
    local_d60 = uVar129;
    uVar110 = FStar_UInt64_eq_mask(uVar131,0);
    uVar111 = FStar_UInt64_eq_mask(uVar122,0);
    uVar112 = FStar_UInt64_eq_mask(uVar133,0);
    uVar113 = FStar_UInt64_eq_mask(uVar129,0);
    uVar114 = FStar_UInt64_eq_mask(uVar121,0);
    uVar115 = FStar_UInt64_eq_mask(uVar119,0);
    uVar116 = FStar_UInt64_eq_mask(uVar125,0);
    uVar117 = FStar_UInt64_eq_mask(uVar124,0);
    if (((uVar129 < 0xffffffff00000000 ||
         uVar129 + 0x100000000 <
         (ulong)(uVar133 != 0xffffffffffffffff ||
                uVar133 + 1 <
                (ulong)(uVar131 < 0xbce6faada7179e84 ||
                       uVar131 + 0x4319055258e8617c < (ulong)(uVar122 < 0xf3b9cac2fc632551)))) &&
        (uVar113 & uVar112 & uVar111 & uVar110) == 0) &&
        ((uVar124 < 0xffffffff00000000 ||
         uVar124 + 0x100000000 <
         (ulong)(uVar125 != 0xffffffffffffffff ||
                uVar125 + 1 <
                (ulong)(uVar121 < 0xbce6faada7179e84 ||
                       uVar121 + 0x4319055258e8617c < (ulong)(uVar119 < 0xf3b9cac2fc632551)))) &&
        (uVar117 & uVar116 & uVar115 & uVar114) == 0)) {
      local_d08 = 0;
      uStack_d00 = 0;
      local_d18 = 0;
      uStack_d10 = 0;
      qinv(&local_d18,&local_d78);
      local_ea8 = 0;
      uStack_ea0 = 0;
      local_eb8 = 0;
      uStack_eb0 = 0;
      local_c68._0_8_ = 0;
      local_c68._8_8_ = 0;
      local_cf8[0x10] = 0;
      local_cf8[0x11] = 0;
      local_cf8[0xc] = *m_q;
      local_cf8[0xd] = m_q[1];
      local_cf8[0xe] = m_q[2];
      local_cf8[0xf] = m_q[3];
      qmont_reduction(&local_eb8,local_cf8 + 0xc);
      uVar124 = uStack_d00;
      uVar122 = local_d08;
      uVar121 = uStack_d10;
      uVar110 = local_d18;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_d18;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_eb8;
      local_cf8[0xc] = SUB168(auVar1 * auVar37,0);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = SUB168(auVar1 * auVar37,8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uStack_d10;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_eb8;
      auVar69 = auVar2 * auVar38 + auVar69;
      uVar119 = auVar69._0_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = auVar69._8_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_d08;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_eb8;
      auVar70 = auVar3 * auVar39 + auVar70;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = auVar70._0_8_;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = auVar70._8_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uStack_d00;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_eb8;
      auVar71 = auVar4 * auVar40 + auVar71;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = auVar71._0_8_;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = auVar71._8_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uStack_eb0;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_d18;
      uVar125 = SUB168(auVar5 * auVar41,8);
      uVar129 = SUB168(auVar5 * auVar41,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uStack_eb0;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uStack_d10;
      auVar72 = auVar6 * auVar42 + auVar72;
      uVar131 = auVar72._0_8_;
      local_cf8[0xd] = uVar129 + uVar119;
      uVar129 = (ulong)CARRY8(uVar129,uVar119);
      uVar119 = uVar131 + uVar125;
      uVar126 = uVar119 + uVar129;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = auVar72._8_8_ + (ulong)(CARRY8(uVar131,uVar125) || CARRY8(uVar119,uVar129));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uStack_eb0;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_d08;
      auVar74 = auVar7 * auVar43 + auVar73 + auVar74;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = auVar74._0_8_;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = auVar74._8_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uStack_eb0;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uStack_d00;
      auVar76 = auVar8 * auVar44 + auVar75 + auVar76;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = auVar76._0_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = auVar76._8_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_ea8;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_d18;
      uVar133 = SUB168(auVar9 * auVar45,8);
      uVar129 = SUB168(auVar9 * auVar45,0);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_ea8;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uStack_d10;
      auVar77 = auVar10 * auVar46 + auVar77;
      uVar125 = auVar77._0_8_;
      local_cf8[0xe] = uVar129 + uVar126;
      uVar129 = (ulong)CARRY8(uVar129,uVar126);
      uVar119 = uVar125 + uVar133;
      uVar131 = uVar119 + uVar129;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = auVar77._8_8_ + (ulong)(CARRY8(uVar125,uVar133) || CARRY8(uVar119,uVar129));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_ea8;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_d08;
      auVar79 = auVar11 * auVar47 + auVar78 + auVar79;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = auVar79._0_8_;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = auVar79._8_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_ea8;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uStack_d00;
      auVar81 = auVar12 * auVar48 + auVar80 + auVar81;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = auVar81._0_8_;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = auVar81._8_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uStack_ea0;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_d18;
      uVar133 = SUB168(auVar13 * auVar49,8);
      uVar129 = SUB168(auVar13 * auVar49,0);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uStack_ea0;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uStack_d10;
      auVar82 = auVar14 * auVar50 + auVar82;
      uVar125 = auVar82._0_8_;
      local_cf8[0xf] = uVar129 + uVar131;
      uVar129 = (ulong)CARRY8(uVar129,uVar131);
      uVar119 = uVar125 + uVar133;
      local_cf8[0x10] = uVar119 + uVar129;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = auVar82._8_8_ + (ulong)(CARRY8(uVar125,uVar133) || CARRY8(uVar119,uVar129));
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uStack_ea0;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_d08;
      auVar84 = auVar15 * auVar51 + auVar83 + auVar84;
      local_cf8[0x11] = auVar84._0_8_;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = auVar84._8_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uStack_ea0;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uStack_d00;
      local_c68 = auVar16 * auVar52 + auVar85 + auVar86;
      qmont_reduction(local_d58,local_cf8 + 0xc);
      local_ea8 = 0;
      uStack_ea0 = 0;
      local_eb8 = 0;
      uStack_eb0 = 0;
      local_c68._0_8_ = 0;
      local_c68._8_8_ = 0;
      local_cf8[0x10] = 0;
      local_cf8[0x11] = 0;
      local_cf8[0xc] = local_d98;
      local_cf8[0xd] = uStack_d90;
      local_cf8[0xe] = local_d88;
      local_cf8[0xf] = uStack_d80;
      qmont_reduction(&local_eb8,local_cf8 + 0xc);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_eb8;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar110;
      local_cf8[0xc] = SUB168(auVar17 * auVar53,0);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = SUB168(auVar17 * auVar53,8);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_eb8;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar121;
      auVar87 = auVar18 * auVar54 + auVar87;
      uVar119 = auVar87._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_eb8;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar122;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = auVar87._8_8_;
      auVar106 = auVar19 * auVar55 + auVar106;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = auVar106._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_eb8;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar124;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = auVar106._8_8_;
      auVar107 = auVar20 * auVar56 + auVar107;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = auVar107._0_8_;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = auVar107._8_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uStack_eb0;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar110;
      uVar125 = SUB168(auVar21 * auVar57,8);
      uVar129 = SUB168(auVar21 * auVar57,0);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uStack_eb0;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar121;
      auVar88 = auVar22 * auVar58 + auVar88;
      uVar131 = auVar88._0_8_;
      local_cf8[0xd] = uVar129 + uVar119;
      uVar129 = (ulong)CARRY8(uVar129,uVar119);
      uVar119 = uVar131 + uVar125;
      uVar126 = uVar119 + uVar129;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = auVar88._8_8_ + (ulong)(CARRY8(uVar131,uVar125) || CARRY8(uVar119,uVar129));
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uStack_eb0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar122;
      auVar90 = auVar23 * auVar59 + auVar89 + auVar90;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = auVar90._0_8_;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = auVar90._8_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uStack_eb0;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar124;
      auVar92 = auVar24 * auVar60 + auVar91 + auVar92;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = auVar92._0_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = auVar92._8_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_ea8;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar110;
      uVar133 = SUB168(auVar25 * auVar61,8);
      uVar129 = SUB168(auVar25 * auVar61,0);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_ea8;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar121;
      auVar93 = auVar26 * auVar62 + auVar93;
      uVar125 = auVar93._0_8_;
      local_cf8[0xe] = uVar129 + uVar126;
      uVar129 = (ulong)CARRY8(uVar129,uVar126);
      uVar119 = uVar125 + uVar133;
      uVar131 = uVar119 + uVar129;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = auVar93._8_8_ + (ulong)(CARRY8(uVar125,uVar133) || CARRY8(uVar119,uVar129));
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_ea8;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar122;
      auVar95 = auVar27 * auVar63 + auVar94 + auVar95;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = auVar95._0_8_;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = auVar95._8_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_ea8;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar124;
      auVar97 = auVar28 * auVar64 + auVar96 + auVar97;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = auVar97._0_8_;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = auVar97._8_8_;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uStack_ea0;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar110;
      uVar125 = SUB168(auVar29 * auVar65,8);
      uVar129 = SUB168(auVar29 * auVar65,0);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uStack_ea0;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar121;
      auVar98 = auVar30 * auVar66 + auVar98;
      uVar121 = auVar98._0_8_;
      local_cf8[0xf] = uVar129 + uVar131;
      uVar129 = (ulong)CARRY8(uVar129,uVar131);
      uVar119 = uVar121 + uVar125;
      local_cf8[0x10] = uVar119 + uVar129;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = auVar98._8_8_ + (ulong)(CARRY8(uVar121,uVar125) || CARRY8(uVar119,uVar129));
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uStack_ea0;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar122;
      auVar100 = auVar31 * auVar67 + auVar99 + auVar100;
      local_cf8[0x11] = auVar100._0_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = auVar100._8_8_;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uStack_ea0;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar124;
      local_c68 = auVar32 * auVar68 + auVar101 + auVar102;
      qmont_reduction(local_d38,local_cf8 + 0xc);
      memset(local_cf8 + 0xc,0,0xc00);
      local_e68 = 0;
      uStack_e60 = 0;
      local_e78 = 0;
      uStack_e70 = 0;
      local_e88 = 0;
      uStack_e80 = 0;
      local_e98 = 0;
      uStack_e90 = 0;
      local_ea8 = 0;
      uStack_ea0 = 0;
      local_eb8 = 0;
      uStack_eb0 = 0;
      local_cf8[0xc] = 0;
      local_cf8[0xd] = 0;
      local_cf8[0xe] = 0;
      local_cf8[0xf] = 0;
      local_cf8[0x10] = 1;
      local_cf8[0x11] = 0xffffffff00000000;
      local_c68._0_8_ = 0xffffffffffffffff;
      local_c68._8_8_ = 0xfffffffe;
      local_c58 = 0;
      uStack_c50 = 0;
      local_c48 = 0;
      uStack_c40 = 0;
      puVar127 = local_df8;
      puVar128 = local_c38;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_c38);
      puVar127 = &local_eb8;
      puVar128 = local_bd8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_bd8);
      puVar127 = &local_eb8;
      puVar128 = local_b78;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_bd8);
      puVar127 = &local_eb8;
      puVar128 = local_b18;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_b18);
      puVar127 = &local_eb8;
      puVar128 = local_ab8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_b78);
      puVar127 = &local_eb8;
      puVar128 = local_a58;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_a58);
      puVar127 = &local_eb8;
      puVar128 = local_9f8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_b18);
      puVar127 = &local_eb8;
      puVar128 = local_998;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_998);
      puVar127 = &local_eb8;
      puVar128 = local_938;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_ab8);
      puVar127 = &local_eb8;
      puVar128 = local_8d8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_8d8);
      puVar127 = &local_eb8;
      puVar128 = local_878;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_a58);
      puVar127 = &local_eb8;
      puVar128 = local_818;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_818);
      puVar127 = &local_eb8;
      puVar128 = local_7b8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_9f8);
      puVar127 = &local_eb8;
      puVar128 = local_758;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_758);
      puVar127 = &local_eb8;
      puVar128 = local_6f8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_998);
      puVar127 = &local_eb8;
      puVar128 = local_698;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_698);
      puVar127 = &local_eb8;
      puVar128 = local_638;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_938);
      puVar127 = &local_eb8;
      puVar128 = local_5d8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_5d8);
      puVar127 = &local_eb8;
      puVar128 = local_578;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_8d8);
      puVar127 = &local_eb8;
      puVar128 = local_518;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_518);
      puVar127 = &local_eb8;
      puVar128 = local_4b8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_878);
      puVar127 = &local_eb8;
      puVar128 = local_458;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_458);
      puVar127 = &local_eb8;
      puVar128 = local_3f8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_818);
      puVar127 = &local_eb8;
      puVar128 = local_398;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_398);
      puVar127 = &local_eb8;
      puVar128 = local_338;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_7b8);
      puVar127 = &local_eb8;
      puVar128 = local_2d8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_2d8);
      puVar127 = &local_eb8;
      puVar128 = local_278;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_758);
      puVar127 = &local_eb8;
      puVar128 = local_218;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_218);
      puVar127 = &local_eb8;
      puVar128 = local_1b8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_double(&local_eb8,local_6f8);
      puVar127 = &local_eb8;
      puVar128 = local_158;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(&local_eb8,local_df8,local_158);
      puVar127 = &local_eb8;
      puVar128 = local_f8;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      puVar127 = (uint64_t *)
                 ((long)Hacl_P256_PrecompTable_precomp_basepoint_table_w5 +
                 (ulong)(iStack_d3c >> 0x1f & 0x60));
      puVar128 = local_e58;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      puVar127 = local_cf8 + 0xc;
      if ((long)local_d38[3] < 0) {
        puVar127 = local_c38;
      }
      puVar128 = local_98;
      for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
        *puVar128 = *puVar127;
        puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
        puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
      }
      point_add(local_e58,local_e58,local_98);
      local_cf8[10] = 0;
      local_cf8[0xb] = 0;
      local_cf8[8] = 0;
      local_cf8[9] = 0;
      local_cf8[6] = 0;
      local_cf8[7] = 0;
      local_cf8[4] = 0;
      local_cf8[5] = 0;
      local_cf8[2] = 0;
      local_cf8[3] = 0;
      local_cf8[0] = 0;
      local_cf8[1] = 0;
      uVar123 = 0xfa;
      do {
        point_double(local_e58,local_e58);
        point_double(local_e58,local_e58);
        point_double(local_e58,local_e58);
        point_double(local_e58,local_e58);
        point_double(local_e58,local_e58);
        uVar130 = uVar123 >> 6;
        uVar132 = uVar123 & 0x3f;
        sVar118 = (sbyte)uVar132;
        uVar109 = (uint)(local_d38[uVar130] >> sVar118);
        if (uVar132 != 0 && uVar123 < 0xc0) {
          uVar109 = uVar109 | (uint)(local_d38[uVar130 + 1] << (-sVar118 & 0x3fU));
        }
        puVar127 = (uint64_t *)((long)local_cf8 + (ulong)((uVar109 & 0x1f) * 0x60) + 0x60);
        puVar128 = local_cf8;
        for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
          *puVar128 = *puVar127;
          puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
          puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
        }
        point_add(local_e58,local_e58,local_cf8);
        uVar109 = (uint)(local_d58[uVar130] >> sVar118);
        if (uVar132 != 0 && uVar123 < 0xc0) {
          uVar109 = uVar109 | (uint)(local_d58[uVar130 + 1] << (-sVar118 & 0x3fU));
        }
        puVar127 = (uint64_t *)
                   ((long)Hacl_P256_PrecompTable_precomp_basepoint_table_w5 +
                   (ulong)((uVar109 & 0x1f) * 0x60));
        puVar128 = local_cf8;
        for (lVar120 = 0xc; lVar120 != 0; lVar120 = lVar120 + -1) {
          *puVar128 = *puVar127;
          puVar127 = puVar127 + (ulong)bVar135 * -2 + 1;
          puVar128 = puVar128 + (ulong)bVar135 * -2 + 1;
        }
        point_add(local_e58,local_e58,local_cf8);
        uVar123 = uVar123 - 5;
      } while (uVar123 != 0xfffffffb);
      uVar110 = FStar_UInt64_eq_mask(local_e18,0);
      uVar111 = FStar_UInt64_eq_mask(local_e10,0);
      uVar112 = FStar_UInt64_eq_mask(local_e08,0);
      uVar113 = FStar_UInt64_eq_mask(local_e00,0);
      if ((uVar113 & uVar112 & uVar111 & uVar110) == 0xffffffffffffffff) {
        _Var134 = false;
      }
      else {
        local_ea8 = 0;
        uStack_ea0 = 0;
        local_eb8 = 0;
        uStack_eb0 = 0;
        local_cf8[0xe] = 0;
        local_cf8[0xf] = 0;
        local_cf8[0xc] = 0;
        local_cf8[0xd] = 0;
        finv(local_cf8 + 0xc,&local_e18);
        fmul0(&local_eb8,local_e58,local_cf8 + 0xc);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_eb8;
        uVar121 = SUB168(auVar33 * ZEXT816(0xffffffff00000001),0);
        uVar122 = uVar121 + uStack_ea0;
        uVar125 = (local_eb8 << 0x20) + uStack_eb0;
        uVar129 = (ulong)CARRY8(local_eb8 << 0x20,uStack_eb0);
        uVar119 = (local_eb8 >> 0x20) + local_ea8;
        uVar131 = uVar119 + uVar129;
        uVar129 = (ulong)(CARRY8(local_eb8 >> 0x20,local_ea8) || CARRY8(uVar119,uVar129));
        uVar124 = uVar122 + uVar129;
        auVar103._8_8_ = 0;
        auVar103._0_8_ =
             SUB168(auVar33 * ZEXT816(0xffffffff00000001),8) + (ulong)CARRY8(uVar121,uStack_ea0) +
             (ulong)CARRY8(uVar122,uVar129);
        uVar121 = uVar125 >> 0x20;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar125;
        uVar122 = (uStack_eb0 << 0x20) + uVar131;
        uVar129 = (ulong)CARRY8(uStack_eb0 << 0x20,uVar131);
        uVar119 = uVar121 + uVar124;
        uVar133 = uVar119 + uVar129;
        auVar1 = auVar34 * ZEXT816(0xffffffff00000001) + auVar103 +
                 ZEXT116(CARRY8(uVar121,uVar124) || CARRY8(uVar119,uVar129));
        uVar124 = auVar1._0_8_;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = auVar1._8_8_;
        uVar121 = uVar122 >> 0x20;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar122;
        uVar125 = (uVar131 << 0x20) + uVar133;
        uVar129 = (ulong)CARRY8(uVar131 << 0x20,uVar133);
        uVar119 = uVar121 + uVar124;
        uVar122 = uVar119 + uVar129;
        auVar1 = auVar35 * ZEXT816(0xffffffff00000001) + auVar104 +
                 ZEXT116(CARRY8(uVar121,uVar124) || CARRY8(uVar119,uVar129));
        uVar124 = auVar1._0_8_;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = auVar1._8_8_;
        uVar121 = uVar125 >> 0x20;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar125;
        uVar126 = (uVar133 << 0x20) + uVar122;
        uVar129 = (ulong)CARRY8(uVar133 << 0x20,uVar122);
        uVar119 = uVar121 + uVar124;
        uVar131 = uVar119 + uVar129;
        auVar1 = auVar36 * ZEXT816(0xffffffff00000001) + auVar105 +
                 ZEXT116(CARRY8(uVar121,uVar124) || CARRY8(uVar119,uVar129));
        uVar121 = auVar1._0_8_;
        uVar122 = auVar1._8_8_;
        uVar129 = (ulong)(uVar131 < 0xffffffff ||
                         uVar131 - 0xffffffff < (ulong)(uVar126 != 0xffffffffffffffff));
        uVar119 = (ulong)(uVar121 < uVar129);
        uVar125 = (ulong)(uVar122 < 0xffffffff00000001 || uVar122 + 0xffffffff < uVar119);
        uVar133 = -uVar125;
        uVar125 = uVar125 - 1;
        uVar124 = uVar126 + 1 & uVar125 | uVar126 & uVar133;
        uVar131 = (uVar131 - 0xffffffff) - (ulong)(uVar126 != 0xffffffffffffffff) & uVar125 |
                  uVar131 & uVar133;
        uVar126 = uVar121 - uVar129 & uVar125 | uVar121 & uVar133;
        uVar121 = uVar125 & (uVar122 + 0xffffffff) - uVar119 | uVar133 & uVar122;
        uVar129 = (ulong)(uVar131 < 0xbce6faada7179e84 ||
                         uVar131 + 0x4319055258e8617c < (ulong)(uVar124 < 0xf3b9cac2fc632551));
        uVar119 = (ulong)(uVar126 != 0xffffffffffffffff || uVar126 + 1 < uVar129);
        local_eb8 = uVar124;
        uStack_eb0 = uVar131;
        local_ea8 = uVar126;
        uStack_ea0 = uVar121;
        uVar110 = FStar_UInt64_eq_mask
                            ((ulong)(uVar121 < 0xffffffff00000000 || uVar121 + 0x100000000 < uVar119
                                    ),0);
        local_eb8 = (uVar124 + 0xc46353d039cdaaf ^ uVar124) & uVar110 ^ uVar124;
        uVar131 = ((uVar131 + 0x4319055258e8617c) - (ulong)(uVar124 < 0xf3b9cac2fc632551) ^ uVar131)
                  & uVar110 ^ uVar131;
        uVar126 = ((uVar126 + 1) - uVar129 ^ uVar126) & uVar110 ^ uVar126;
        uVar121 = ((uVar121 + 0x100000000) - uVar119 ^ uVar121) & uVar110 ^ uVar121;
        uStack_eb0 = uVar131;
        local_ea8 = uVar126;
        uStack_ea0 = uVar121;
        uVar110 = FStar_UInt64_eq_mask(local_eb8,local_d98);
        uVar111 = FStar_UInt64_eq_mask(uVar131,uStack_d90);
        uVar112 = FStar_UInt64_eq_mask(uVar126,local_d88);
        uVar113 = FStar_UInt64_eq_mask(uVar121,uStack_d80);
        _Var134 = (uVar113 & uVar112 & uVar111 & uVar110) == 0xffffffffffffffff;
      }
    }
  }
  return _Var134;
}

Assistant:

static inline bool
ecdsa_verify_msg_as_qelem(
  uint64_t *m_q,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t tmp[28U] = { 0U };
  uint64_t *pk = tmp;
  uint64_t *r_q = tmp + 12U;
  uint64_t *s_q = tmp + 16U;
  uint64_t *u1 = tmp + 20U;
  uint64_t *u2 = tmp + 24U;
  bool is_pk_valid = load_point_vartime(pk, public_key);
  bn_from_bytes_be4(r_q, signature_r);
  bn_from_bytes_be4(s_q, signature_s);
  uint64_t is_r_valid = bn_is_lt_order_and_gt_zero_mask4(r_q);
  uint64_t is_s_valid = bn_is_lt_order_and_gt_zero_mask4(s_q);
  bool is_rs_valid = is_r_valid == 0xFFFFFFFFFFFFFFFFULL && is_s_valid == 0xFFFFFFFFFFFFFFFFULL;
  if (!(is_pk_valid && is_rs_valid))
  {
    return false;
  }
  uint64_t sinv[4U] = { 0U };
  qinv(sinv, s_q);
  qmul_mont(sinv, m_q, u1);
  qmul_mont(sinv, r_q, u2);
  uint64_t res[12U] = { 0U };
  point_mul_double_g(res, u1, u2, pk);
  if (is_point_at_inf_vartime(res))
  {
    return false;
  }
  uint64_t x[4U] = { 0U };
  to_aff_point_x(x, res);
  qmod_short(x, x);
  bool res1 = bn_is_eq_vartime4(x, r_q);
  return res1;
}